

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.h
# Opt level: O1

ostream * operator<<(ostream *os,Quaternion<int> *obj)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,obj->n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,obj->ni);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,obj->nj);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,obj->nk);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const Quaternion<T>& obj) {
    os << "(" << obj.a() << "," << obj.b() << "," << obj.c() << "," << obj.d() << ")"; 
    return os;
}